

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O0

void sha1_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  ulong local_28;
  size_t i;
  sha1_sw *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  sha1_block_pad((sha1_block *)&hash[-7].binarysink_,(BinarySink *)&hash[-2].binarysink_);
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    PUT_32BIT_MSB_FIRST(digest + local_28 * 4,*(uint32_t *)((long)&hash[-8].vt + local_28 * 4));
  }
  return;
}

Assistant:

static void sha1_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha1_sw *s = container_of(hash, sha1_sw, hash);

    sha1_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 5; i++)
        PUT_32BIT_MSB_FIRST(digest + 4*i, s->core[i]);
}